

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
slang::CommandLine::setPositional
          (CommandLine *this,OptionCallback *cb,string_view valueName,bool isFileName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  runtime_error *this_01;
  Option *__tmp;
  element_type *__s;
  
  if ((this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa0);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00508228;
    __s = (element_type *)(p_Var1 + 1);
    memset(__s,0,0x90);
    *(_Atomic_word **)&p_Var1[3]._M_use_count = &p_Var1[4]._M_use_count;
    *(_Atomic_word **)&p_Var1[5]._M_use_count = &p_Var1[6]._M_use_count;
    *(_Atomic_word **)&p_Var1[7]._M_use_count = &p_Var1[8]._M_use_count;
    (this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = __s;
    this_00 = (this->positional).
              super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      __s = (this->positional).
            super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&__s->valueName,0,(char *)(__s->valueName)._M_string_length,
               (ulong)valueName._M_str);
    std::
    variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
    ::operator=((variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
                 *)(this->positional).
                   super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ,cb);
    ((this->positional).super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->isFileName = isFileName;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10,cb,valueName._M_len);
  std::runtime_error::runtime_error(this_01,"Can only set one positional argument");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CommandLine::setPositional(OptionCallback cb, string_view valueName, bool isFileName) {
    if (positional)
        throw std::runtime_error("Can only set one positional argument");

    positional = std::make_shared<Option>();
    positional->valueName = valueName;
    positional->storage = cb;
    positional->isFileName = isFileName;
}